

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNErrCode
SUNNonlinSolSetConvTestFn_FixedPoint
          (SUNNonlinearSolver NLS,SUNNonlinSolConvTestFn CTestFn,void *ctest_data)

{
  SUNContext sunctx_local_scope_;
  void *ctest_data_local;
  SUNNonlinSolConvTestFn CTestFn_local;
  SUNNonlinearSolver NLS_local;
  
  *(SUNNonlinSolConvTestFn *)((long)NLS->content + 8) = CTestFn;
  *(void **)((long)NLS->content + 0xa8) = ctest_data;
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolSetConvTestFn_FixedPoint(SUNNonlinearSolver NLS,
                                                SUNNonlinSolConvTestFn CTestFn,
                                                void* ctest_data)
{
  SUNFunctionBegin(NLS->sunctx);
  SUNAssert(CTestFn, SUN_ERR_ARG_CORRUPT);

  FP_CONTENT(NLS)->CTest = CTestFn;

  /* attach convergence test data */
  FP_CONTENT(NLS)->ctest_data = ctest_data;

  return SUN_SUCCESS;
}